

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet_test.c
# Opt level: O3

int main(void)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  MppPacket packet;
  long local_18;
  
  local_18 = 0;
  _mpp_log_l(4,"mpp_packet_test","mpp_packet_test start\n",0);
  __ptr = malloc(0x400);
  if (__ptr == (void *)0x0) {
    _mpp_log_l(2,"mpp_packet_test","mpp_packet_test malloc failed\n",0);
    iVar1 = -2;
  }
  else {
    iVar1 = mpp_packet_init(&local_18,__ptr,0x400);
    if (iVar1 == 0) {
      mpp_packet_set_eos(local_18);
      mpp_packet_deinit(&local_18);
      free(__ptr);
      iVar1 = 0;
      pcVar2 = "mpp_packet_test success\n";
      goto LAB_0010125f;
    }
    _mpp_log_l(2,"mpp_packet_test","mpp_packet_test mpp_packet_init failed\n",0);
    if (local_18 != 0) {
      mpp_packet_deinit(&local_18);
    }
    free(__ptr);
  }
  pcVar2 = "mpp_packet_test failed\n";
LAB_0010125f:
  _mpp_log_l(4,"mpp_packet_test",pcVar2,0);
  return iVar1;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    MppPacket packet = NULL;
    void *data = NULL;
    size_t size = MPP_PACKET_TEST_SIZE;

    mpp_log("mpp_packet_test start\n");

    data = malloc(size);
    if (NULL == data) {
        mpp_err("mpp_packet_test malloc failed\n");
        goto MPP_PACKET_failed;
    }

    ret = mpp_packet_init(&packet, data, size);
    if (MPP_OK != ret) {
        mpp_err("mpp_packet_test mpp_packet_init failed\n");
        goto MPP_PACKET_failed;
    }
    mpp_packet_set_eos(packet);
    if (MPP_OK != ret) {
        mpp_err("mpp_packet_test mpp_packet_set_eos failed\n");
        goto MPP_PACKET_failed;
    }
    mpp_packet_deinit(&packet);

    free(data);
    mpp_log("mpp_packet_test success\n");
    return ret;

MPP_PACKET_failed:
    if (packet)
        mpp_packet_deinit(&packet);

    if (data)
        free(data);

    mpp_log("mpp_packet_test failed\n");
    return ret;
}